

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

int_fast8_t
math::wide_integer::uintwide_t<65536u,unsigned_int,std::allocator<unsigned_int>,false>::
compare_ranges<unsigned_int_const*,unsigned_int_const*>(uint *a,uint *b,unsigned_fast_type count)

{
  bool bVar1;
  uint *puVar2;
  reference pvVar3;
  int_fast8_t local_61;
  reverse_iterator<const_unsigned_int_*> local_60;
  uint local_54;
  reverse_iterator<const_unsigned_int_*> rStack_50;
  value_left_type value_b;
  value_type_conflict local_44;
  value_type_conflict value_a;
  reverse_iterator<const_unsigned_int_*> local_38;
  reverse_iterator<const_unsigned_int_*> pb;
  reverse_iterator<const_unsigned_int_*> pa;
  int_fast8_t n_return;
  unsigned_fast_type count_local;
  uint *b_local;
  uint *a_local;
  
  puVar2 = detail::advance_and_point<unsigned_int_const*,unsigned_long>(a,count);
  detail::iterator_detail::reverse_iterator<const_unsigned_int_*>::reverse_iterator(&pb,puVar2);
  puVar2 = detail::advance_and_point<unsigned_int_const*,unsigned_long>(b,count);
  detail::iterator_detail::reverse_iterator<const_unsigned_int_*>::reverse_iterator
            (&local_38,puVar2);
  do {
    detail::iterator_detail::reverse_iterator<const_unsigned_int_*>::reverse_iterator
              ((reverse_iterator<const_unsigned_int_*> *)&stack0xffffffffffffffc0,a);
    bVar1 = detail::iterator_detail::operator!=
                      (&pb,(reverse_iterator<const_unsigned_int_*> *)&stack0xffffffffffffffc0);
    if (!bVar1) {
      return '\0';
    }
    rStack_50 = detail::iterator_detail::reverse_iterator<const_unsigned_int_*>::operator++(&pb,0);
    pvVar3 = detail::iterator_detail::reverse_iterator<const_unsigned_int_*>::operator*
                       (&stack0xffffffffffffffb0);
    local_44 = *pvVar3;
    local_60 = detail::iterator_detail::reverse_iterator<const_unsigned_int_*>::operator++
                         (&local_38,0);
    pvVar3 = detail::iterator_detail::reverse_iterator<const_unsigned_int_*>::operator*(&local_60);
    local_54 = *pvVar3;
  } while (local_44 == local_54);
  local_61 = '\x01';
  if (local_44 <= local_54) {
    local_61 = -1;
  }
  return local_61;
}

Assistant:

static constexpr auto compare_ranges(      InputIteratorLeftType  a,
                                               InputIteratorRightType b,
                                         const unsigned_fast_type     count) -> std::int_fast8_t
    {
      auto n_return = static_cast<std::int_fast8_t>(INT8_C(0));

      detail::iterator_detail::reverse_iterator<InputIteratorLeftType>  pa(detail::advance_and_point(a, count));
      detail::iterator_detail::reverse_iterator<InputIteratorRightType> pb(detail::advance_and_point(b, count));

      while(pa != detail::iterator_detail::reverse_iterator<InputIteratorLeftType>(a)) // NOLINT(altera-id-dependent-backward-branch)
      {
        using value_left_type = typename detail::iterator_detail::iterator_traits<InputIteratorLeftType>::value_type;

        const auto value_a = *pa++;
        const auto value_b = static_cast<value_left_type>(*pb++);

        if(value_a != value_b)
        {
          n_return =
            static_cast<std::int_fast8_t>
            (
              (value_a > value_b)
                ? static_cast<std::int_fast8_t>(INT8_C(1))
                : static_cast<std::int_fast8_t>(INT8_C(-1))
            );

          break;
        }
      }

      return n_return;
    }